

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UBool __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::populatePreceding(BreakCache *this,UErrorCode *status)

{
  UVector32 *this_00;
  uint uVar1;
  RuleBasedBreakIterator *pRVar2;
  int32_t *piVar3;
  UErrorCode *status_00;
  UBool UVar4;
  UBool UVar5;
  uint16_t uVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int64_t iVar10;
  uint uVar11;
  int32_t iVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int32_t dictSegEndPosition;
  int32_t position;
  int32_t positionStatusIdx;
  int32_t local_44;
  int32_t local_40;
  UBool local_39;
  UErrorCode *local_38;
  
  if (U_ZERO_ERROR < *status) {
    return '\0';
  }
  iVar12 = this->fBoundaries[this->fStartBufIdx];
  UVar4 = '\0';
  if (iVar12 != 0) {
    local_44 = 0;
    local_40 = 0;
    UVar4 = DictionaryCache::preceding(this->fBI->fDictionaryCache,iVar12,&local_44,&local_40);
    iVar15 = iVar12;
    local_38 = status;
    if (UVar4 == '\0') {
      do {
        iVar8 = 0;
        iVar7 = 0;
        if (0x1e < iVar15) {
          iVar7 = handleSafePrevious(this->fBI,iVar15 + -0x1e);
        }
        iVar9 = 0;
        if (1 < iVar7 + 1U) {
          pRVar2 = this->fBI;
          pRVar2->fPosition = iVar7;
          iVar8 = handleNext(pRVar2);
          if (iVar8 <= iVar7 + 4) {
            utext_setNativeIndex_63(&this->fBI->fText,(long)iVar8);
            iVar10 = utext_getPreviousNativeIndex_63(&this->fBI->fText);
            if (iVar10 == iVar7) {
              iVar8 = handleNext(this->fBI);
            }
          }
          iVar9 = this->fBI->fRuleStatusIndex;
        }
        iVar15 = iVar7;
      } while (iVar12 <= iVar8);
      this_00 = &this->fSideBuffer;
      local_44 = iVar8;
      local_40 = iVar9;
      UVector32::removeAllElements(this_00);
      status_00 = local_38;
      iVar15 = (this->fSideBuffer).count;
      if (((-2 < iVar15) && (iVar15 < (this->fSideBuffer).capacity)) ||
         (UVar4 = UVector32::expandCapacity(this_00,iVar15 + 1,local_38), UVar4 != '\0')) {
        (this->fSideBuffer).elements[(this->fSideBuffer).count] = iVar8;
        piVar3 = &(this->fSideBuffer).count;
        *piVar3 = *piVar3 + 1;
      }
      iVar15 = (this->fSideBuffer).count;
      if (((-2 < iVar15) && (iVar15 < (this->fSideBuffer).capacity)) ||
         (UVar4 = UVector32::expandCapacity(this_00,iVar15 + 1,status_00), UVar4 != '\0')) {
        (this->fSideBuffer).elements[(this->fSideBuffer).count] = iVar9;
        piVar3 = &(this->fSideBuffer).count;
        *piVar3 = *piVar3 + 1;
      }
      do {
        iVar8 = local_40;
        iVar7 = local_44;
        pRVar2 = this->fBI;
        pRVar2->fPosition = local_44;
        iVar9 = handleNext(pRVar2);
        pRVar2 = this->fBI;
        local_40 = pRVar2->fRuleStatusIndex;
        local_44 = iVar9;
        if (iVar9 != -1) {
          if (pRVar2->fDictionaryCharCount != 0) {
            DictionaryCache::populateDictionary(pRVar2->fDictionaryCache,iVar7,iVar9,iVar8,local_40)
            ;
            UVar4 = DictionaryCache::following
                              (this->fBI->fDictionaryCache,iVar7,&local_44,&local_40);
            if (UVar4 != '\0') {
              do {
                local_39 = UVar4;
                iVar7 = local_44;
                if (iVar12 <= local_44) break;
                iVar15 = (this->fSideBuffer).count;
                if (((-2 < iVar15) && (iVar15 < (this->fSideBuffer).capacity)) ||
                   (UVar4 = UVector32::expandCapacity(this_00,iVar15 + 1,local_38), UVar4 != '\0'))
                {
                  (this->fSideBuffer).elements[(this->fSideBuffer).count] = iVar7;
                  piVar3 = &(this->fSideBuffer).count;
                  *piVar3 = *piVar3 + 1;
                }
                iVar8 = local_40;
                iVar15 = (this->fSideBuffer).count;
                if (((-2 < iVar15) && (iVar15 < (this->fSideBuffer).capacity)) ||
                   (UVar4 = UVector32::expandCapacity(this_00,iVar15 + 1,local_38), UVar4 != '\0'))
                {
                  (this->fSideBuffer).elements[(this->fSideBuffer).count] = iVar8;
                  piVar3 = &(this->fSideBuffer).count;
                  *piVar3 = *piVar3 + 1;
                }
                UVar5 = DictionaryCache::following
                                  (this->fBI->fDictionaryCache,iVar7,&local_44,&local_40);
                UVar4 = local_39;
              } while (UVar5 != '\0');
              if (local_39 != '\0') goto LAB_002b05fa;
            }
          }
          iVar7 = local_44;
          if (local_44 < iVar12) {
            iVar15 = (this->fSideBuffer).count;
            if (((-2 < iVar15) && (iVar15 < (this->fSideBuffer).capacity)) ||
               (UVar4 = UVector32::expandCapacity(this_00,iVar15 + 1,local_38), UVar4 != '\0')) {
              (this->fSideBuffer).elements[(this->fSideBuffer).count] = iVar7;
              piVar3 = &(this->fSideBuffer).count;
              *piVar3 = *piVar3 + 1;
            }
            iVar7 = local_40;
            iVar15 = (this->fSideBuffer).count;
            if (((-2 < iVar15) && (iVar15 < (this->fSideBuffer).capacity)) ||
               (UVar4 = UVector32::expandCapacity(this_00,iVar15 + 1,local_38), UVar4 != '\0')) {
              (this->fSideBuffer).elements[(this->fSideBuffer).count] = iVar7;
              piVar3 = &(this->fSideBuffer).count;
              *piVar3 = *piVar3 + 1;
            }
          }
        }
LAB_002b05fa:
      } while ((iVar9 != -1) && (local_44 < iVar12));
      iVar15 = (this->fSideBuffer).count;
      UVar4 = '\0';
      uVar6 = 0;
      if (iVar15 != 0) {
        if (0 < iVar15) {
          (this->fSideBuffer).count = iVar15 - 1U;
          uVar6 = (uint16_t)(this->fSideBuffer).elements[iVar15 - 1U];
        }
        iVar15 = (this->fSideBuffer).count;
        if (iVar15 < 1) {
          iVar12 = 0;
        }
        else {
          uVar11 = iVar15 - 1;
          (this->fSideBuffer).count = uVar11;
          iVar12 = (this->fSideBuffer).elements[uVar11];
        }
        uVar11 = this->fStartBufIdx - 1U & 0x7f;
        if (uVar11 == this->fEndBufIdx) {
          this->fEndBufIdx = this->fEndBufIdx - 1U & 0x7f;
        }
        this->fBoundaries[uVar11] = iVar12;
        this->fStatuses[uVar11] = uVar6;
        this->fStartBufIdx = uVar11;
        this->fBufIdx = uVar11;
        this->fTextIdx = iVar12;
        UVar4 = '\x01';
      }
      uVar11 = (this->fSideBuffer).count;
      uVar14 = (ulong)uVar11;
      if (uVar11 != 0) {
        uVar11 = this->fStartBufIdx;
        uVar16 = this->fEndBufIdx;
        piVar3 = (this->fSideBuffer).elements;
        uVar1 = this->fBufIdx;
        do {
          iVar12 = 0;
          if ((int)uVar14 < 1) {
            uVar6 = 0;
          }
          else {
            uVar13 = (int)uVar14 - 1;
            uVar14 = (ulong)uVar13;
            (this->fSideBuffer).count = uVar13;
            uVar6 = (uint16_t)piVar3[uVar14];
          }
          if (0 < (int)uVar14) {
            uVar13 = (int)uVar14 - 1;
            uVar14 = (ulong)uVar13;
            (this->fSideBuffer).count = uVar13;
            iVar12 = piVar3[uVar14];
          }
          uVar11 = uVar11 - 1 & 0x7f;
          if (uVar11 == uVar16) {
            if (uVar1 == uVar16) {
              return UVar4;
            }
            uVar16 = uVar16 - 1 & 0x7f;
            this->fEndBufIdx = uVar16;
          }
          this->fBoundaries[uVar11] = iVar12;
          this->fStatuses[uVar11] = uVar6;
          this->fStartBufIdx = uVar11;
        } while ((int)uVar14 != 0);
      }
    }
    else {
      uVar11 = this->fStartBufIdx - 1U & 0x7f;
      if (uVar11 == this->fEndBufIdx) {
        this->fEndBufIdx = this->fEndBufIdx - 1U & 0x7f;
      }
      this->fBoundaries[uVar11] = local_44;
      this->fStatuses[uVar11] = (uint16_t)local_40;
      this->fStartBufIdx = uVar11;
      this->fBufIdx = uVar11;
      this->fTextIdx = local_44;
      UVar4 = '\x01';
    }
  }
  return UVar4;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }